

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# synchcache.hpp
# Opt level: O3

int __thiscall
CorUnix::CSynchCache<CorUnix::CSynchWaitController>::Get
          (CSynchCache<CorUnix::CSynchWaitController> *this,CPalThread *pthrCurrent,int n,
          CSynchWaitController **ppObjs)

{
  _USynchCacheStackNode *p_Var1;
  CSynchWaitController *pCVar2;
  ulong uVar3;
  ulong uVar4;
  
  InternalEnterCriticalSection(pthrCurrent,&this->m_cs);
  p_Var1 = (this->m_pHead).m_val;
  uVar4 = 0;
  if (0 < n && p_Var1 != (_USynchCacheStackNode *)0x0) {
    uVar4 = 0;
    do {
      ppObjs[uVar4] = (CSynchWaitController *)p_Var1;
      p_Var1 = p_Var1->next;
      uVar4 = uVar4 + 1;
      if (p_Var1 == (_USynchCacheStackNode *)0x0) break;
    } while (uVar4 < (uint)n);
  }
  (this->m_pHead).m_val = p_Var1;
  (this->m_iDepth).m_val = (this->m_iDepth).m_val - (int)uVar4;
  if (((this->m_pHead).m_val == (_USynchCacheStackNode *)0x0) && ((this->m_iDepth).m_val != 0)) {
    fprintf(_stderr,"SYNCCACHE: Invalid cache depth value");
    DebugBreak();
  }
  InternalLeaveCriticalSection(pthrCurrent,&this->m_cs);
  if ((int)uVar4 < n) {
    uVar4 = uVar4 & 0xffffffff;
    do {
      pCVar2 = (CSynchWaitController *)InternalMalloc(0x38);
      if (pCVar2 == (CSynchWaitController *)0x0) goto LAB_00348698;
      (pCVar2->super_CSynchControllerBase).m_psdSynchData = (CSynchData *)0x0;
      *(undefined8 *)&(pCVar2->super_CSynchControllerBase).m_wdWaitDomain = 0;
      (pCVar2->super_CSynchControllerBase).m_ctCtrlrType = WaitController;
      (pCVar2->super_CSynchControllerBase).m_odObjectDomain = ProcessLocalObject;
      (pCVar2->super_CSynchControllerBase).m_potObjectType = (CObjectType *)0x0;
      (pCVar2->super_ISynchWaitController)._vptr_ISynchWaitController = (_func_int **)0x0;
      (pCVar2->super_CSynchControllerBase).m_pthrOwner = (CPalThread *)0x0;
      pCVar2->m_pProcLocalData = (CProcProcessLocalData *)0x0;
      memset(pCVar2,0,0x38);
      ppObjs[uVar4] = pCVar2;
      uVar4 = uVar4 + 1;
    } while ((uint)n != uVar4);
    uVar4 = (ulong)(uint)n;
  }
LAB_00348698:
  if ((int)uVar4 != 0) {
    uVar3 = 0;
    do {
      pCVar2 = ppObjs[uVar3];
      (pCVar2->super_ISynchWaitController)._vptr_ISynchWaitController =
           (_func_int **)&PTR_CanThreadWaitWithoutBlocking_014c2e78;
      pCVar2->m_pProcLocalData = (CProcProcessLocalData *)0x0;
      uVar3 = uVar3 + 1;
    } while ((uVar4 & 0xffffffff) != uVar3);
  }
  return (int)uVar4;
}

Assistant:

int Get(CPalThread * pthrCurrent, int n, T ** ppObjs)
        {
            void * pvObjRaw;
            USynchCacheStackNode * pNode;
            int i = 0,j;

            Lock(pthrCurrent);
            pNode = m_pHead;
            while (pNode && i < n)
            {
                ppObjs[i] = (T *)pNode;
                pNode = pNode->next;
                i++;
            }
            m_pHead = pNode;
            m_iDepth -= i;

#ifdef _DEBUG
            if (NULL == m_pHead && m_iDepth != 0)
            {
                // Can't use ASSERT here, since this is header
                // is included by other headers with inline methods
                // which causes template instatiation in the header
                // where the DEBUG CHANNEL is not defined and cannot
                // be defined
                fprintf(stderr,"SYNCCACHE: Invalid cache depth value");
                DebugBreak();
            }
#endif // _DEBUG

            Unlock(pthrCurrent);

            for (j=i;j<n;j++)
            {
                pvObjRaw = (void *) InternalNew<USynchCacheStackNode>();
                if (NULL == pvObjRaw)
                    break;
#ifdef _DEBUG
                memset(pvObjRaw, 0, sizeof(USynchCacheStackNode));
#endif
                ppObjs[j] = reinterpret_cast<T*>(pvObjRaw);
            }

            for (i=0;i<j;i++)
            {
                new ((void *)ppObjs[i]) T;
            }

            return j;
        }